

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

unsigned_long flatbuffers::HashFnv1a<unsigned_long>(char *input)

{
  unsigned_long uVar1;
  
  uVar1 = 0xcbf29ce484222645;
  for (; (ulong)(byte)*input != 0; input = (char *)((byte *)input + 1)) {
    uVar1 = (uVar1 ^ (byte)*input) * 0x100000001b3;
  }
  return uVar1;
}

Assistant:

T HashFnv1a(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash ^= static_cast<unsigned char>(*c);
    hash *= FnvTraits<T>::kFnvPrime;
  }
  return hash;
}